

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

size_t Assimp::Ogre::VertexElement::TypeSize(Type type)

{
  size_t sStack_10;
  Type type_local;
  
  switch(type) {
  case VET_FLOAT1:
    sStack_10 = 4;
    break;
  case VET_FLOAT2:
    sStack_10 = 8;
    break;
  case VET_FLOAT3:
    sStack_10 = 0xc;
    break;
  case VET_FLOAT4:
    sStack_10 = 0x10;
    break;
  case VET_COLOUR:
  case VET_COLOUR_ARGB:
  case VET_COLOUR_ABGR:
    sStack_10 = 4;
    break;
  case VET_SHORT1:
    sStack_10 = 2;
    break;
  case VET_SHORT2:
    sStack_10 = 4;
    break;
  case VET_SHORT3:
    sStack_10 = 6;
    break;
  case VET_SHORT4:
    sStack_10 = 8;
    break;
  case VET_UBYTE4:
    sStack_10 = 4;
    break;
  case VET_DOUBLE1:
    sStack_10 = 8;
    break;
  case VET_DOUBLE2:
    sStack_10 = 0x10;
    break;
  case VET_DOUBLE3:
    sStack_10 = 0x18;
    break;
  case VET_DOUBLE4:
    sStack_10 = 0x20;
    break;
  case VET_USHORT1:
    sStack_10 = 2;
    break;
  case VET_USHORT2:
    sStack_10 = 4;
    break;
  case VET_USHORT3:
    sStack_10 = 6;
    break;
  case VET_USHORT4:
    sStack_10 = 8;
    break;
  case VET_INT1:
    sStack_10 = 4;
    break;
  case VET_INT2:
    sStack_10 = 8;
    break;
  case VET_INT3:
    sStack_10 = 0xc;
    break;
  case VET_INT4:
    sStack_10 = 0x10;
    break;
  case VET_UINT1:
    sStack_10 = 4;
    break;
  case VET_UINT2:
    sStack_10 = 8;
    break;
  case VET_UINT3:
    sStack_10 = 0xc;
    break;
  case VET_UINT4:
    sStack_10 = 0x10;
    break;
  default:
    sStack_10 = 0;
  }
  return sStack_10;
}

Assistant:

size_t VertexElement::TypeSize(Type type)
{
    switch(type)
    {
        case VET_COLOUR:
        case VET_COLOUR_ABGR:
        case VET_COLOUR_ARGB:
            return sizeof(unsigned int);
        case VET_FLOAT1:
            return sizeof(float);
        case VET_FLOAT2:
            return sizeof(float)*2;
        case VET_FLOAT3:
            return sizeof(float)*3;
        case VET_FLOAT4:
            return sizeof(float)*4;
        case VET_DOUBLE1:
            return sizeof(double);
        case VET_DOUBLE2:
            return sizeof(double)*2;
        case VET_DOUBLE3:
            return sizeof(double)*3;
        case VET_DOUBLE4:
            return sizeof(double)*4;
        case VET_SHORT1:
            return sizeof(short);
        case VET_SHORT2:
            return sizeof(short)*2;
        case VET_SHORT3:
            return sizeof(short)*3;
        case VET_SHORT4:
            return sizeof(short)*4;
        case VET_USHORT1:
            return sizeof(unsigned short);
        case VET_USHORT2:
            return sizeof(unsigned short)*2;
        case VET_USHORT3:
            return sizeof(unsigned short)*3;
        case VET_USHORT4:
            return sizeof(unsigned short)*4;
        case VET_INT1:
            return sizeof(int);
        case VET_INT2:
            return sizeof(int)*2;
        case VET_INT3:
            return sizeof(int)*3;
        case VET_INT4:
            return sizeof(int)*4;
        case VET_UINT1:
            return sizeof(unsigned int);
        case VET_UINT2:
            return sizeof(unsigned int)*2;
        case VET_UINT3:
            return sizeof(unsigned int)*3;
        case VET_UINT4:
            return sizeof(unsigned int)*4;
        case VET_UBYTE4:
            return sizeof(unsigned char)*4;
    }
    return 0;
}